

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBaseVS::Cleanup(BasicStdLayoutBaseVS *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDisable(this_00,0x8c89);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->m_buffer);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisable(GL_RASTERIZER_DISCARD);
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(2, m_buffer);
		glDeleteVertexArrays(1, &m_vertex_array);
		return NO_ERROR;
	}